

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

ecs_entity_t
ecs_type_contains(ecs_world_t *world,ecs_type_t type_1,ecs_type_t type_2,_Bool match_all,
                 _Bool match_prefab)

{
  ecs_entity_t *component;
  int32_t iVar1;
  int32_t iVar2;
  undefined8 *puVar3;
  void *pvVar4;
  void *pvVar5;
  ecs_entity_t eVar6;
  ecs_entity_t e2;
  int32_t t2_count;
  int32_t t1_count;
  ecs_entity_t *t2_array;
  ecs_entity_t *t1_array;
  ecs_entity_t e1;
  int local_30;
  int32_t i_1;
  int32_t i_2;
  _Bool match_prefab_local;
  _Bool match_all_local;
  ecs_type_t type_2_local;
  ecs_type_t type_1_local;
  ecs_world_t *world_local;
  
  type_1_local = (ecs_type_t)world;
  _ecs_assert(world != (ecs_world_t *)0x0,0xc,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/type.c"
              ,0x3b);
  if (type_1_local == (ecs_type_t)0x0) {
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/type.c"
                  ,0x3b,
                  "ecs_entity_t ecs_type_contains(ecs_world_t *, ecs_type_t, ecs_type_t, _Bool, _Bool)"
                 );
  }
  ecs_get_stage((ecs_world_t **)&type_1_local);
  if (type_1 == (ecs_type_t)0x0) {
    world_local = (ecs_world_t *)0x0;
  }
  else {
    _ecs_assert(type_2 != (ecs_type_t)0x0,0xc,(char *)0x0,"type_2 != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/type.c"
                ,0x42);
    if (type_2 == (ecs_type_t)0x0) {
      __assert_fail("type_2 != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/type.c"
                    ,0x42,
                    "ecs_entity_t ecs_type_contains(ecs_world_t *, ecs_type_t, ecs_type_t, _Bool, _Bool)"
                   );
    }
    if (type_1 == type_2) {
      puVar3 = (undefined8 *)_ecs_vector_first(type_1,8,0x10);
      world_local = (ecs_world_t *)*puVar3;
    }
    else {
      e1._4_4_ = 0;
      t1_array = (ecs_entity_t *)0x0;
      pvVar4 = _ecs_vector_first(type_1,8,0x10);
      pvVar5 = _ecs_vector_first(type_2,8,0x10);
      _ecs_assert(pvVar4 != (void *)0x0,0xc,(char *)0x0,"t1_array != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/type.c"
                  ,0x4d);
      if (pvVar4 == (void *)0x0) {
        __assert_fail("t1_array != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/type.c"
                      ,0x4d,
                      "ecs_entity_t ecs_type_contains(ecs_world_t *, ecs_type_t, ecs_type_t, _Bool, _Bool)"
                     );
      }
      _ecs_assert(pvVar5 != (void *)0x0,0xc,(char *)0x0,"t2_array != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/type.c"
                  ,0x4e);
      if (pvVar5 == (void *)0x0) {
        __assert_fail("t2_array != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/type.c"
                      ,0x4e,
                      "ecs_entity_t ecs_type_contains(ecs_world_t *, ecs_type_t, ecs_type_t, _Bool, _Bool)"
                     );
      }
      iVar1 = ecs_vector_count(type_1);
      iVar2 = ecs_vector_count(type_2);
      for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
        component = *(ecs_entity_t **)((long)pvVar5 + (long)local_30 * 8);
        if (iVar1 <= e1._4_4_) {
          return 0;
        }
        t1_array = *(ecs_entity_t **)((long)pvVar4 + (long)e1._4_4_ * 8);
        while (t1_array < component) {
          e1._4_4_ = e1._4_4_ + 1;
          if (iVar1 <= e1._4_4_) {
            return 0;
          }
          t1_array = *(ecs_entity_t **)((long)pvVar4 + (long)e1._4_4_ * 8);
        }
        if (t1_array == component) {
          if (!match_all) {
            return (ecs_entity_t)t1_array;
          }
          e1._4_4_ = e1._4_4_ + 1;
          if (e1._4_4_ < iVar1) {
            t1_array = *(ecs_entity_t **)((long)pvVar4 + (long)e1._4_4_ * 8);
          }
        }
        else {
          if ((((match_prefab) && (component != (ecs_entity_t *)0x6)) &&
              (component != (ecs_entity_t *)0x101)) &&
             ((component != (ecs_entity_t *)0x103 &&
              (eVar6 = ecs_find_entity_in_prefabs
                                 ((ecs_world_t *)type_1_local,0,type_1,(ecs_entity_t)component,0),
              eVar6 != 0)))) {
            t1_array = component;
          }
          if (t1_array == component) {
            if (!match_all) {
              return (ecs_entity_t)t1_array;
            }
          }
          else if (match_all) {
            return 0;
          }
        }
      }
      if (match_all) {
        world_local = (ecs_world_t *)t1_array;
      }
      else {
        world_local = (ecs_world_t *)0x0;
      }
    }
  }
  return (ecs_entity_t)world_local;
}

Assistant:

ecs_entity_t ecs_type_contains(
    ecs_world_t *world,
    ecs_type_t type_1,
    ecs_type_t type_2,
    bool match_all,
    bool match_prefab)
{
    ecs_assert(world != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_get_stage(&world);
    
    if (!type_1) {
        return 0;
    }

    ecs_assert(type_2 != NULL, ECS_INTERNAL_ERROR, NULL);

    if (type_1 == type_2) {
        return *(ecs_vector_first(type_1, ecs_entity_t));
    }

    int32_t i_2, i_1 = 0;
    ecs_entity_t e1 = 0;
    ecs_entity_t *t1_array = ecs_vector_first(type_1, ecs_entity_t);
    ecs_entity_t *t2_array = ecs_vector_first(type_2, ecs_entity_t);

    ecs_assert(t1_array != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(t2_array != NULL, ECS_INTERNAL_ERROR, NULL);

    int32_t t1_count = ecs_vector_count(type_1);
    int32_t t2_count = ecs_vector_count(type_2);

    for (i_2 = 0; i_2 < t2_count; i_2 ++) {
        ecs_entity_t e2 = t2_array[i_2];

        if (i_1 >= t1_count) {
            return 0;
        }

        e1 = t1_array[i_1];

        if (e2 > e1) {
            do {
                i_1 ++;
                if (i_1 >= t1_count) {
                    return 0;
                }
                e1 = t1_array[i_1];
            } while (e2 > e1);
        }

        if (e1 != e2) {
            if (match_prefab && e2 != 
                ecs_typeid(EcsName) && e2 != 
                EcsPrefab && e2 != 
                EcsDisabled) 
            {
                if (ecs_find_entity_in_prefabs(world, 0, type_1, e2, 0)) {
                    e1 = e2;
                }
            }

            if (e1 != e2) {
                if (match_all) return 0;
            } else if (!match_all) {
                return e1;
            }
        } else {
            if (!match_all) return e1;
            i_1 ++;
            if (i_1 < t1_count) {
                e1 = t1_array[i_1];
            }
        }
    }

    if (match_all) {
        return e1;
    } else {
        return 0;
    }
}